

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void __thiscall SemanticTables::visit(SemanticTables *this,FormalListNode *formalListNode)

{
  FormalListNode *pFVar1;
  bool bVar2;
  int iVar3;
  TokenNode *pTVar4;
  StructSymbol *pSVar5;
  int size;
  char *lexeme;
  
  pTVar4 = formalListNode->id;
  if (pTVar4 != (TokenNode *)0x0) {
    (*(pTVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar4,this);
    pTVar4 = formalListNode->id;
    if ((pTVar4 != (TokenNode *)0x0) &&
       (lexeme = (pTVar4->super_ExpNode).lexeme, lexeme != (char *)0x0)) goto LAB_001103d9;
  }
  fprintf(_stderr,"[SEMANTIC ERROR - formalListNode] FUNCTION PARAMETER WITHOUT A NAME, line: %d\n",
          (ulong)(uint)(formalListNode->super_ASTNode).line);
  pTVar4 = formalListNode->id;
  lexeme = (pTVar4->super_ExpNode).lexeme;
LAB_001103d9:
  iVar3 = formalListNode->type->id->token;
  size = 4;
  if (((1 < iVar3 - 0xbU) && (formalListNode->pointer == (PointerNode *)0x0)) &&
     (size = 1, iVar3 == 10)) {
    pSVar5 = StructTable::cSearch(structTable,(pTVar4->super_ExpNode).typeLexeme);
    size = pSVar5->size;
  }
  if (formalListNode->array == (ArrayNode *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = atoi((formalListNode->array->super_ExpNode).lexeme);
    size = size * iVar3;
  }
  bVar2 = VarTable::cInsert(varTable,formalListNode->type,lexeme,
                            formalListNode->pointer != (PointerNode *)0x0,iVar3,true,size);
  if (!bVar2) {
    visit();
  }
  pFVar1 = formalListNode->next;
  if (pFVar1 != (FormalListNode *)0x0) {
    (*(pFVar1->super_ASTNode)._vptr_ASTNode[3])(pFVar1,this);
    return;
  }
  return;
}

Assistant:

void SemanticTables::visit(FormalListNode *formalListNode) {

    if (formalListNode->getId() != NULL) {
        formalListNode->getId()->accept(this);
    }

    if (!formalListNode->getId() || !formalListNode->getId()->getLexeme()) {
        fprintf(stderr, "[SEMANTIC ERROR - formalListNode] FUNCTION PARAMETER WITHOUT A NAME, line: %d\n",
                formalListNode->getLine());
    }

    const char *parameterName = formalListNode->getId()->getLexeme();

    int size = 0;
    // Set var size
    if( formalListNode->getType()->getType() == INT ||formalListNode->getType()->getType() == FLOAT || formalListNode->getPointer() != NULL)
        size = INT32_SIZE;
    else if (formalListNode->getType()->getType() == ID) {
        StructSymbol* structSymbol = structTable->cSearch(formalListNode->getId()->getTypeLexeme());
        size = structSymbol->getSize();
    } else {
        size = INT8_SIZE;
    }

    int arraySize = -1;

    if (formalListNode->getArray()) {
        arraySize = atoi(formalListNode->getArray()->getLexeme());
        size *= arraySize;
    }

    if (!varTable->cInsert(formalListNode->getType(), parameterName, formalListNode->getPointer() != NULL, arraySize,
                           BOOL_TRUE, size)) {
        fprintf(stderr, "[SEMANTIC ERROR - formalListNode] VARIABLE ALREADY EXISTS, line: %d, lexeme: %s \n",
                formalListNode->getLine(), formalListNode->getId()->getLexeme());
    }



    if (formalListNode->getNext() != NULL) {
        formalListNode->getNext()->accept(this);
    }
}